

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Entity::to_bytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                Entity *this)

{
  initializer_list<unsigned_char> __l;
  allocator<unsigned_char> local_41;
  uint8_t local_40;
  uint8_t local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  uint8_t local_3b;
  byte local_3a;
  undefined1 local_39;
  iterator local_38;
  size_type local_30;
  undefined1 local_22;
  byte local_21;
  uint8_t local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  uint8_t byte7;
  uint8_t byte6;
  uint8_t byte5;
  uint8_t byte4;
  uint8_t byte3;
  uint8_t entity_id_to_use_tiles_from;
  bool use_tiles_from_other_entity;
  uint8_t byte2;
  uint8_t byte1;
  uint8_t byte0;
  Entity *this_local;
  
  byte6 = (this->_attrs).position.x & 0x3f | (this->_attrs).orientation << 6;
  byte7 = (this->_attrs).position.y & 0x3f | (this->_attrs).palette << 6;
  local_1b = (this->_attrs).speed & 7;
  if (((this->_attrs).fightable & 1U) != 0) {
    local_1b = local_1b | 0x80;
  }
  if (((this->_attrs).liftable & 1U) != 0) {
    local_1b = local_1b | 0x40;
  }
  if (((this->_attrs).talkable & 1U) != 0) {
    local_1b = local_1b | 0x20;
  }
  if (((this->_attrs).flag_unknown_2_4 & 1U) != 0) {
    local_1b = local_1b | 0x10;
  }
  if (((this->_attrs).flag_unknown_2_3 & 1U) != 0) {
    local_1b = local_1b | 8;
  }
  local_1c = (this->_attrs).entity_to_use_tiles_from != (Entity *)0x0;
  local_1d = 0;
  _byte5 = this;
  this_local = (Entity *)__return_storage_ptr__;
  if ((this->_attrs).entity_to_use_tiles_from != (Entity *)0x0) {
    local_1d = entity_id((this->_attrs).entity_to_use_tiles_from);
  }
  local_1e = local_1d & 0xf;
  if (((this->_attrs).position.half_x & 1U) != 0) {
    local_1e = local_1e | 0x80;
  }
  if (((this->_attrs).position.half_y & 1U) != 0) {
    local_1e = local_1e | 0x40;
  }
  if (((this->_attrs).flag_unknown_3_5 & 1U) != 0) {
    local_1e = local_1e | 0x20;
  }
  if ((local_1c & 1) != 0) {
    local_1e = local_1e | 0x10;
  }
  local_3c = (this->_attrs).dialogue << 2 | (byte)((this->_attrs).behavior_id >> 8) & 3;
  local_3b = (this->_attrs).type_id;
  local_21 = (this->_attrs).position.z & 0xf;
  if (((this->_attrs).can_pass_through & 1U) != 0) {
    local_21 = local_21 | 0x10;
  }
  if (((this->_attrs).appear_after_player_moved_away & 1U) != 0) {
    local_21 = local_21 | 0x20;
  }
  if (((this->_attrs).position.half_z & 1U) != 0) {
    local_21 = local_21 | 0x40;
  }
  if (((this->_attrs).gravity_immune & 1U) != 0) {
    local_21 = local_21 | 0x80;
  }
  local_39 = (undefined1)(this->_attrs).behavior_id;
  local_40 = byte6;
  local_3f = byte7;
  local_3e = local_1b;
  local_3d = local_1e;
  local_3a = local_21;
  local_38 = &local_40;
  local_30 = 8;
  local_22 = local_39;
  local_20 = local_3b;
  local_1f = local_3c;
  std::allocator<unsigned_char>::allocator(&local_41);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__l,&local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Entity::to_bytes() const
{
    // Byte 0
    uint8_t byte0 = _attrs.position.x & 0x3F;
    byte0 |= (_attrs.orientation & 0x3) << 6;

    // Byte 1
    uint8_t byte1 = _attrs.position.y & 0x3F;
    byte1 |= ((_attrs.palette & 0x3) << 6);

    // Byte 2
    uint8_t byte2 = _attrs.speed & 0x07;
    if(_attrs.fightable)          byte2 |= 0x80;
    if(_attrs.liftable)           byte2 |= 0x40;
    if(_attrs.talkable)           byte2 |= 0x20;
    if(_attrs.flag_unknown_2_4)   byte2 |= 0x10;
    if(_attrs.flag_unknown_2_3)   byte2 |= 0x08;

    // Byte 3
    bool use_tiles_from_other_entity = (_attrs.entity_to_use_tiles_from != nullptr);
    uint8_t entity_id_to_use_tiles_from = 0;
    if(_attrs.entity_to_use_tiles_from)
        entity_id_to_use_tiles_from = _attrs.entity_to_use_tiles_from->entity_id();

    uint8_t byte3 = entity_id_to_use_tiles_from & 0x0F;
    if(_attrs.position.half_x)                 byte3 |= 0x80;
    if(_attrs.position.half_y)                 byte3 |= 0x40;
    if(_attrs.flag_unknown_3_5)            byte3 |= 0x20;
    if(use_tiles_from_other_entity)  byte3 |= 0x10;

    // Byte 4
    uint8_t byte4 = (_attrs.dialogue & 0x3F) << 2;
    byte4 |= (_attrs.behavior_id >> 8) & 0x3;

    // Byte 5
    uint8_t byte5 = _attrs.type_id;

    // Byte 6
    uint8_t byte6 = _attrs.position.z & 0x0F;
    if(_attrs.can_pass_through)   byte6 |= 0x10;
    if(_attrs.appear_after_player_moved_away)   byte6 |= 0x20;
    if(_attrs.position.half_z)        byte6 |= 0x40;
    if(_attrs.gravity_immune)   byte6 |= 0x80;

    // Byte 7
    uint8_t byte7 = _attrs.behavior_id & 0x00FF;

    return { byte0, byte1, byte2, byte3, byte4, byte5, byte6, byte7 };
}